

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# failure_test.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<bool> __l;
  TestSuite ts;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffd18;
  TestRange<bool> *in_stack_fffffffffffffd20;
  allocator *paVar1;
  _func_int *in_stack_fffffffffffffd28;
  _func_int *__f;
  test_func *in_stack_fffffffffffffd30;
  function<int_()> *this;
  string *in_stack_fffffffffffffd38;
  string *test_name;
  TestSuite *in_stack_fffffffffffffd40;
  TestSuite *this_00;
  allocator_type *in_stack_fffffffffffffd48;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffd50;
  iterator pbVar2;
  TestSuite *this_01;
  allocator local_259;
  string local_258 [32];
  undefined1 local_238 [39];
  undefined1 local_211 [33];
  string local_1f0 [39];
  undefined1 local_1c9 [73];
  string local_180 [37];
  bool local_15b [3];
  bool *local_158;
  undefined8 local_150;
  undefined1 local_e1 [73];
  string local_98 [16];
  TestRange<bool> *in_stack_ffffffffffffff78;
  _func_int_bool *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  TestSuite *in_stack_ffffffffffffff90;
  
  TestSuite::TestSuite
            (in_stack_fffffffffffffd40,(int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
             (char **)in_stack_fffffffffffffd30);
  nuraft::debugging_options::get_instance();
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_fffffffffffffd20,
             SUB81((ulong)in_stack_fffffffffffffd18 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"simple conflict test",(allocator *)(local_e1 + 0x48));
  std::function<int()>::function<int(&)(),void>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28)
  ;
  TestSuite::doTest(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::function<int_()>::~function((function<int_()> *)0x12069f);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)(local_e1 + 0x48));
  this_01 = (TestSuite *)local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_e1 + 1),"remove not responding server with quorum test",
             (allocator *)this_01);
  local_15b[1] = false;
  local_15b[2] = true;
  local_158 = local_15b + 1;
  local_150 = 2;
  pbVar2 = local_15b;
  std::allocator<bool>::allocator((allocator<bool> *)0x120724);
  __l._M_len = (size_type)this_01;
  __l._M_array = pbVar2;
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffd50,__l,in_stack_fffffffffffffd48);
  TestRange<bool>::TestRange(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  TestSuite::doTest<bool,int(*)(bool)>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  TestRange<bool>::~TestRange((TestRange<bool> *)0x120792);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x12079f)
  ;
  std::allocator<bool>::~allocator((allocator<bool> *)0x1207ac);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  paVar1 = (allocator *)(local_1c9 + 0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"force log compaction test",paVar1);
  std::function<int()>::function<int(&)(),void>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28)
  ;
  TestSuite::doTest(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::function<int_()>::~function((function<int_()> *)0x120835);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)(local_1c9 + 0x48));
  this_00 = (TestSuite *)local_1c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1c9 + 1),"uncommitted config for new leader test",(allocator *)this_00
            );
  test_name = local_1f0;
  std::function<int()>::function<int(&)(),void>(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28)
  ;
  TestSuite::doTest(this_00,test_name,in_stack_fffffffffffffd30);
  std::function<int_()>::~function((function<int_()> *)0x1208be);
  std::__cxx11::string::~string((string *)(local_1c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1c9);
  this = (function<int_()> *)local_211;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_211 + 1),"removed server late step down test",(allocator *)this);
  __f = (_func_int *)local_238;
  std::function<int()>::function<int(&)(),void>(this,__f);
  TestSuite::doTest(this_00,test_name,this);
  std::function<int_()>::~function((function<int_()> *)0x120947);
  std::__cxx11::string::~string((string *)(local_211 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_211);
  paVar1 = &local_259;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"remove server on pending configs test",paVar1);
  std::function<int()>::function<int(&)(),void>(this,__f);
  TestSuite::doTest(this_00,test_name,this);
  std::function<int_()>::~function((function<int_()> *)0x1209c8);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  TestSuite::~TestSuite(this_01);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite ts(argc, argv);

    ts.options.printTestMessage = true;

    // Disable reconnection timer for deterministic test.
    debugging_options::get_instance().disable_reconn_backoff_ = true;

    ts.doTest( "simple conflict test",
               simple_conflict_test );

    ts.doTest( "remove not responding server with quorum test",
               rmv_not_resp_srv_wq_test,
               TestRange<bool>({false, true}) );

    ts.doTest( "force log compaction test",
               force_log_compaction_test );

    ts.doTest( "uncommitted config for new leader test",
               uncommitted_conf_new_leader_test );

    ts.doTest( "removed server late step down test",
               removed_server_late_step_down_test );

    ts.doTest( "remove server on pending configs test",
               remove_server_on_pending_configs_test );

    return 0;
}